

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serializer.cpp
# Opt level: O0

void __thiscall Serializer_BigEndian_Test::TestBody(Serializer_BigEndian_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_a0;
  Message local_98;
  ByteData local_90;
  string local_78;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  undefined1 local_38 [8];
  Serializer builder;
  Serializer_BigEndian_Test *this_local;
  
  builder._32_8_ = this;
  cfd::core::Serializer::Serializer((Serializer *)local_38);
  cfd::core::Serializer::AddDirectBigEndianNumber((Serializer *)local_38,0x1020304);
  cfd::core::Serializer::Output(&local_90,(Serializer *)local_38);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_78,&local_90);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((EqHelper<false> *)local_58,"\"01020304\"","builder.Output().GetHex()",
             (char (*) [9])"01020304",&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  cfd::core::ByteData::~ByteData(&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x39,message);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  cfd::core::Serializer::~Serializer((Serializer *)local_38);
  return;
}

Assistant:

TEST(Serializer, BigEndian) {
  Serializer builder;
  builder.AddDirectBigEndianNumber(0x01020304);
  EXPECT_EQ("01020304", builder.Output().GetHex());
}